

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

Token * __thiscall llbuild::ninja::Lexer::lexVariableString(Lexer *this,Token *result)

{
  char cVar1;
  
  do {
    if (this->bufferPos == (this->buffer).Data + (this->buffer).Length) {
      cVar1 = -1;
    }
    else {
      cVar1 = *this->bufferPos;
    }
    if (cVar1 < '$') {
      if (((cVar1 == -1) || (cVar1 == '\n')) || (cVar1 == '\r')) {
        result->tokenKind = String;
        result->length = *(int *)&this->bufferPos - *(int *)&result->start;
        return result;
      }
    }
    else if (cVar1 == '$') {
      getNextChar(this);
    }
    getNextChar(this);
  } while( true );
}

Assistant:

Token& Lexer::lexVariableString(Token& result) {
  // String tokens in variable assignments consume until the end of the line.
  while (true) {
    int c = peekNextChar();

    // If this is an escape character, skip the next character.
    if (c == '$') {
      getNextChar(); // Consume the actual '$'.
      getNextChar(); // Consume the next character.
      continue;
    }

    // Otherwise, continue only if this is not the EOL or EOF.
    if (c == '\n' || c == -1 || c == '\r')
      break;

    getNextChar();
  }

  return setTokenKind(result, Token::Kind::String);
}